

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask6_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  uVar1 = in[9];
  uVar2 = in[0xb];
  uVar3 = in[5];
  uVar4 = in[7];
  *out = uVar3 << 0x1e | in[4] << 0x18 | in[3] << 0x12 | in[2] << 0xc | in[1] << 6 | *in;
  uVar5 = in[10];
  uVar6 = in[0xd];
  uVar7 = in[0xc];
  out[1] = uVar5 << 0x1c | uVar1 << 0x16 | in[8] << 0x10 | uVar4 << 10 | in[6] << 4 | uVar3 >> 2;
  out[2] = in[0xf] << 0x1a | in[0xe] << 0x14 | uVar6 << 0xe | uVar7 << 8 | uVar2 << 2 | uVar5 >> 4;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask6_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (6 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  ++in;

  return out;
}